

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O2

void __thiscall
amrex::SplineDistFcnElement2d::single_spline_cpdist
          (SplineDistFcnElement2d *this,RealVect pt,Real x0,Real x1,Real Dx0,Real Dx1,Real y0,
          Real y1,Real Dy0,Real Dy1,Real *t,RealVect *mincp,Real *mindist)

{
  Real RVar1;
  RealVect pt_00;
  RealVect *p;
  ostream *poVar2;
  Real tnew;
  Real d2yf;
  Real dyf;
  Real d2xf;
  Real dxf;
  RealVect spt;
  Real local_c8;
  Real local_c0;
  Real local_b8;
  Real local_b0;
  Real local_a8;
  Real local_a0;
  Real local_98;
  Real local_90;
  Real local_88;
  Real local_80;
  double *local_78;
  RealVect *local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  RealVect local_48;
  
  *t = 0.5;
  local_48.vect[0] = 0.0;
  local_48.vect[1] = 0.0;
  local_48.vect[2] = 0.0;
  local_b8 = x0;
  local_b0 = x1;
  local_a8 = Dx0;
  local_a0 = Dx1;
  local_98 = y0;
  local_90 = y1;
  local_88 = Dy0;
  local_80 = Dy1;
  local_70 = mincp;
  RVar1 = dist(this,pt,x0,x1,Dx0,Dx1,y0,y1,Dy0,Dy1,t,&local_48);
  *mindist = RVar1;
  local_c0 = *t;
  local_78 = mindist;
  dxbydt(this,local_c0,local_98,local_90,local_88,local_80,&local_60,&local_68);
  dxbydt(this,local_c0,local_b8,local_b0,local_a8,local_a0,&local_50,&local_58);
  local_c8 = local_c0 -
             (local_50 * (local_48.vect[0] - pt.vect[0]) +
             (local_48.vect[1] - pt.vect[1]) * local_60) /
             (local_68 * (local_48.vect[1] - pt.vect[1]) +
             local_58 * (local_48.vect[0] - pt.vect[0]) + local_50 * local_50 + local_60 * local_60)
  ;
  if (0.0 <= local_c8) {
    if (1.0 < local_c8) {
      local_c8 = 1.0;
    }
  }
  else {
    local_c8 = 0.0;
  }
  *t = local_c8;
  pt_00.vect[1] = pt.vect[1];
  pt_00.vect[0] = pt.vect[0];
  pt_00.vect[2] = pt.vect[2];
  RVar1 = dist(this,pt_00,local_b8,local_b0,local_a8,local_a0,local_98,local_90,local_88,local_80,
               &local_c8,&local_48);
  p = local_70;
  *local_78 = RVar1;
  local_70->vect[2] = local_48.vect[2];
  local_70->vect[0] = local_48.vect[0];
  local_70->vect[1] = local_48.vect[1];
  if ((*local_78 == 0.0) && (!NAN(*local_78))) {
    std::operator<<((ostream *)&std::cout,"identified minimum distance of 0.0 at t = ");
    poVar2 = std::ostream::_M_insert<double>(*t);
    poVar2 = std::operator<<(poVar2,"; cp = ");
    poVar2 = amrex::operator<<(poVar2,p);
    poVar2 = std::operator<<(poVar2," for p = ");
    poVar2 = amrex::operator<<(poVar2,&pt);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void SplineDistFcnElement2d::single_spline_cpdist(amrex::RealVect pt,
                                    amrex::Real x0, amrex::Real x1,
                                    amrex::Real Dx0, amrex::Real Dx1,
                                    amrex::Real y0, amrex::Real y1,
                                    amrex::Real Dy0, amrex::Real Dy1,
                                    amrex::Real& t, amrex::RealVect& mincp,
                                    amrex::Real& mindist) const {
  t = 0.5;

  amrex::RealVect spt, deltapt;
  const int maxIters = 1;

  amrex::Real dxf, d2xf, dyf, d2yf, tnew;

  for (int i=0; i<maxIters; ++i) {
    mindist = dist(pt, x0, x1, Dx0, Dx1, y0, y1, Dy0, Dy1, t, spt);
    dxbydt(t, y0, y1, Dy0, Dy1, dyf, d2yf);
    dxbydt(t, x0, x1, Dx0, Dx1, dxf, d2xf);

    deltapt =  spt - pt;
    tnew = t - (deltapt[0]*dxf + deltapt[1]*dyf) / (
      dxf*dxf + dyf*dyf + deltapt[0]*d2xf + deltapt[1]*d2yf);

    if (tnew < 0.0) {
      tnew = 0.0;
    } else if (tnew > 1.0) {
      tnew = 1.0;
    }
    t = tnew;
  }
  mindist = dist(pt, x0, x1, Dx0, Dx1, y0, y1, Dy0, Dy1, tnew, spt);
  mincp = spt;

  if (mindist == 0.0) {
    std::cout << "identified minimum distance of 0.0 at t = " << t
              << "; cp = " << mincp << " for p = " << pt << std::endl;
  }
  return;
}